

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_clause_simplification_rule.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::InClauseSimplificationRule::Apply
          (InClauseSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  bool bVar4;
  reference pvVar5;
  BoundOperatorExpression *pBVar6;
  reference pvVar7;
  pointer pEVar8;
  BoundCastExpression *pBVar9;
  ClientContext *context;
  type expr;
  BoundConstantExpression *this_02;
  ulong uVar10;
  reference pvVar11;
  size_type sVar12;
  vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_true>
  cast_list;
  LogicalType target_type;
  Value constant_value;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_100;
  vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
  local_f8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_d8;
  LogicalOperator *local_d0;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar6 = BaseExpression::Cast<duckdb::BoundOperatorExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  this_00 = &pBVar6->children;
  pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,0);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar7);
  if ((pEVar8->super_BaseExpression).expression_class == BOUND_CAST) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](this_00,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    pBVar9 = BaseExpression::Cast<duckdb::BoundCastExpression>(&pEVar8->super_BaseExpression);
    this_01 = &pBVar9->child;
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_01);
    if ((pEVar8->super_BaseExpression).expression_class == BOUND_COLUMN_REF) {
      local_d8 = this_01;
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      LogicalType::LogicalType(&local_c8,&pEVar8->return_type);
      bVar4 = BoundCastExpression::CastIsInvertible
                        (&local_c8,&(pBVar9->super_Expression).return_type);
      if (bVar4) {
        local_f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (8 < (ulong)((long)(pBVar6->children).
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pBVar6->children).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          sVar12 = 1;
          local_d0 = op;
          do {
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[](this_00,sVar12);
            pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar7);
            if ((pEVar8->super_BaseExpression).expression_class != BOUND_CONSTANT)
            goto LAB_01155ca7;
            context = Rule::GetContext((Rule *)local_d0);
            pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[](this_00,sVar12);
            expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(pvVar7);
            ExpressionExecutor::EvaluateScalar(&local_b0,context,expr,false);
            bVar4 = BoundCastExpression::CastIsInvertible(&local_b0.type_,&local_c8);
            if ((!bVar4) || (bVar4 = Value::DefaultTryCastAs(&local_b0,&local_c8,false), !bVar4)) {
              (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
              Value::~Value(&local_b0);
              goto LAB_01155ce3;
            }
            this_02 = (BoundConstantExpression *)operator_new(0x98);
            Value::Value(&local_70,&local_b0);
            BoundConstantExpression::BoundConstantExpression(this_02,&local_70);
            local_100._M_head_impl = this_02;
            Value::~Value(&local_70);
            ::std::
            vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>>>
                        *)&local_f8,
                       (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                        *)&local_100);
            if (local_100._M_head_impl != (BoundConstantExpression *)0x0) {
              (*((local_100._M_head_impl)->super_Expression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
            Value::~Value(&local_b0);
            uVar10 = (long)(pBVar6->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pBVar6->children).
                           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            sVar12 = sVar12 + 1;
          } while (sVar12 < (ulong)((long)uVar10 >> 3));
          if (8 < uVar10) {
            sVar12 = 1;
            do {
              pvVar11 = vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_true>
                                      *)&local_f8,sVar12 - 1);
              _Var1._M_head_impl =
                   (pvVar11->
                   super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
                   .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl;
              (pvVar11->
              super_unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
              .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl =
                   (BoundConstantExpression *)0x0;
              pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       ::operator[](this_00,sVar12);
              _Var2._M_head_impl =
                   (pvVar7->
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              (pvVar7->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   &(_Var1._M_head_impl)->super_Expression;
              if (_Var2._M_head_impl != (Expression *)0x0) {
                (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
              }
              sVar12 = sVar12 + 1;
            } while (sVar12 < (ulong)((long)(pBVar6->children).
                                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pBVar6->children).
                                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](this_00,0);
        _Var2._M_head_impl =
             (local_d8->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (local_d8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var3._M_head_impl =
             (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pvVar7->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
        if (_Var3._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
LAB_01155ca7:
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_01155ce3:
        ::std::
        vector<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>_>_>
        ::~vector(&local_f8);
      }
      else {
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      }
      LogicalType::~LogicalType(&local_c8);
      return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> InClauseSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                         bool &changes_made, bool is_root) {
	auto &expr = bindings[0].get().Cast<BoundOperatorExpression>();
	if (expr.children[0]->GetExpressionClass() != ExpressionClass::BOUND_CAST) {
		return nullptr;
	}
	auto &cast_expression = expr.children[0]->Cast<BoundCastExpression>();
	if (cast_expression.child->GetExpressionClass() != ExpressionClass::BOUND_COLUMN_REF) {
		return nullptr;
	}
	//! The goal here is to remove the cast from the probe expression
	//! and apply a cast to the constant expressions. We can only do this
	//! if the semantics do not change, which only happens when BOTH casts
	//! are invertible.
	auto target_type = cast_expression.source_type();
	if (!BoundCastExpression::CastIsInvertible(target_type, cast_expression.return_type)) {
		return nullptr;
	}
	vector<unique_ptr<BoundConstantExpression>> cast_list;
	//! First check if we can cast all children
	for (size_t i = 1; i < expr.children.size(); i++) {
		if (expr.children[i]->GetExpressionClass() != ExpressionClass::BOUND_CONSTANT) {
			return nullptr;
		}
		D_ASSERT(expr.children[i]->IsFoldable());
		auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), *expr.children[i]);
		if (!BoundCastExpression::CastIsInvertible(constant_value.type(), target_type)) {
			return nullptr;
		}
		auto new_constant = constant_value.DefaultTryCastAs(target_type);
		if (!new_constant) {
			return nullptr;
		} else {
			auto new_constant_expr = make_uniq<BoundConstantExpression>(constant_value);
			cast_list.push_back(std::move(new_constant_expr));
		}
	}
	//! We can cast, so we move the new constant
	for (size_t i = 1; i < expr.children.size(); i++) {
		expr.children[i] = std::move(cast_list[i - 1]);

		//		expr->children[i] = std::move(new_constant_expr);
	}
	//! We can cast the full list, so we move the column
	expr.children[0] = std::move(cast_expression.child);
	return nullptr;
}